

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::WriteTargetSpecifics
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *config)

{
  string *psVar1;
  ostream *poVar2;
  string local_d0 [32];
  string local_b0;
  string local_90;
  undefined1 local_60 [8];
  string rootpath;
  string outpath;
  string *config_local;
  ostream *fout_local;
  cmGhsMultiTargetGenerator *this_local;
  
  std::__cxx11::string::string((string *)(rootpath.field_2._M_local_buf + 8));
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  std::__cxx11::string::string((string *)local_60,(string *)psVar1);
  if (this->TagType != SUBPROJECT) {
    cmGeneratorTarget::GetDirectory(&local_90,this->GeneratorTarget,config,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)(rootpath.field_2._M_local_buf + 8),(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_b0,&this->LocalGenerator->super_cmLocalGenerator,(string *)local_60,
               (string *)(rootpath.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)(rootpath.field_2._M_local_buf + 8),(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    poVar2 = std::operator<<(fout,"    :binDirRelative=\"");
    poVar2 = std::operator<<(poVar2,(string *)(rootpath.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(fout,"    -o \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->TargetNameReal);
    poVar2 = std::operator<<(poVar2,"\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
            (local_d0,this->LocalGenerator,this->GeneratorTarget);
  std::__cxx11::string::operator=((string *)(rootpath.field_2._M_local_buf + 8),local_d0);
  std::__cxx11::string::~string(local_d0);
  poVar2 = std::operator<<(fout,"    :outputDirRelative=\"");
  poVar2 = std::operator<<(poVar2,(string *)(rootpath.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,"\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(rootpath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteTargetSpecifics(std::ostream& fout,
                                                     const std::string& config)
{
  std::string outpath;
  std::string rootpath = this->LocalGenerator->GetCurrentBinaryDirectory();

  if (this->TagType != GhsMultiGpj::SUBPROJECT) {
    // set target binary file destination
    outpath = this->GeneratorTarget->GetDirectory(config);
    outpath =
      this->LocalGenerator->MaybeConvertToRelativePath(rootpath, outpath);
    fout << "    :binDirRelative=\"" << outpath << "\"" << std::endl;
    fout << "    -o \"" << this->TargetNameReal << "\"" << std::endl;
  }

  // set target object file destination
  outpath = this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  fout << "    :outputDirRelative=\"" << outpath << "\"" << std::endl;
}